

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absGlaOld.c
# Opt level: O1

Vec_Int_t * Gla_ManRefinement2(Gla_Man_t *p)

{
  uint uVar1;
  Gia_Obj_t *pGVar2;
  Vec_Int_t *pVVar3;
  int *piVar4;
  Gia_Obj_t *pGVar5;
  sat_solver2 *psVar6;
  Gia_Man_t *pGVar7;
  int *piVar8;
  Gia_Obj_t *pGVar9;
  bool bVar10;
  int iVar11;
  int iVar12;
  uint uVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  Vec_Int_t *vCos;
  int *piVar17;
  Vec_Int_t *vPis;
  Vec_Int_t *vPPis;
  Vec_Int_t *vRoAnds;
  Vec_Int_t *pVVar18;
  Abc_Cex_t *pAVar19;
  long lVar20;
  int *piVar21;
  char *__function;
  uint uVar22;
  uint uVar23;
  Vec_Int_t *extraout_RDX;
  Vec_Int_t *extraout_RDX_00;
  Vec_Int_t *pVVar25;
  long lVar26;
  char *__file;
  Gla_Man_t *pGVar27;
  char *__assertion;
  uint uVar28;
  ulong uVar29;
  long local_68;
  ulong uVar24;
  
  Gla_ManRefinement2::Sign = Gla_ManRefinement2::Sign + 1;
  vCos = (Vec_Int_t *)malloc(0x10);
  vCos->nCap = 1000;
  vCos->nSize = 0;
  piVar17 = (int *)malloc(4000);
  vCos->pArray = piVar17;
  vPis = (Vec_Int_t *)malloc(0x10);
  vPis->nCap = 1000;
  vPis->nSize = 0;
  piVar17 = (int *)malloc(4000);
  vPis->pArray = piVar17;
  vPPis = (Vec_Int_t *)malloc(0x10);
  vPPis->nCap = 1000;
  vPPis->nSize = 0;
  piVar17 = (int *)malloc(4000);
  vPPis->pArray = piVar17;
  vRoAnds = (Vec_Int_t *)malloc(0x10);
  vRoAnds->nCap = 1000;
  vRoAnds->nSize = 0;
  piVar17 = (int *)malloc(4000);
  vRoAnds->pArray = piVar17;
  Gla_ManCollect(p,vPis,vPPis,vCos,vRoAnds);
  uVar13 = p->pPars->iFrame;
  if (-1 < (int)uVar13) {
    local_68 = 0;
    pVVar25 = extraout_RDX;
    do {
      if (p->pGia->nObjs < 1) {
LAB_00581f60:
        __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                      ,0x1b7,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
      }
      pVVar18 = p->pvRefis;
      iVar16 = (int)(local_68 + 1);
      Vec_IntFillExtra(pVVar18,iVar16,(int)pVVar25);
      if (pVVar18->nSize <= local_68) goto LAB_00581f96;
      piVar17 = pVVar18->pArray;
      piVar17[local_68] = 0;
      piVar17[local_68] = (Gla_ManRefinement2::Sign & 0xfffU) << 0x13;
      iVar14 = vPis->nSize;
      iVar15 = (int)local_68;
      pVVar25 = extraout_RDX_00;
      if (0 < (long)iVar14) {
        piVar17 = vPis->pArray;
        lVar20 = 0;
        do {
          lVar26 = (long)piVar17[lVar20];
          if ((lVar26 < 0) || (p->pGia->nObjs <= piVar17[lVar20])) goto LAB_00581f7f;
          pGVar2 = p->pGia->pObjs;
          if (pGVar2 == (Gia_Obj_t *)0x0) break;
          pVVar3 = p->pvRefis;
          pVVar18 = pVVar3 + lVar26;
          Vec_IntFillExtra(pVVar18,iVar16,(int)pVVar25);
          if (pVVar3[lVar26].nSize <= local_68) goto LAB_00581f96;
          pGVar2 = pGVar2 + lVar26;
          piVar4 = pVVar18->pArray;
          piVar4[local_68] = 0;
          pGVar5 = p->pGia->pObjs;
          if ((pGVar2 < pGVar5) || (pGVar5 + p->pGia->nObjs <= pGVar2)) goto LAB_00581f60;
          iVar11 = (int)((ulong)((long)pGVar2 - (long)pGVar5) >> 2) * -0x55555555;
          iVar12 = Gla_ManCheckVar(p,p->pObj2Obj[iVar11],iVar15);
          if (iVar12 == 0) {
            uVar13 = 0;
          }
          else {
            psVar6 = p->pSat;
            uVar13 = Gla_ManGetVar(p,p->pObj2Obj[iVar11],iVar15);
            if (((int)uVar13 < 0) || (psVar6->size <= (int)uVar13)) goto LAB_00581fb5;
            uVar13 = (uint)(psVar6->model[uVar13] == 1);
          }
          uVar28 = piVar4[local_68];
          piVar4[local_68] = uVar28 & 0xfff80006 | uVar13;
          uVar13 = uVar28 & 0x80000006 | uVar13 | (Gla_ManRefinement2::Sign & 0xfffU) << 0x13;
          pVVar25 = (Vec_Int_t *)(ulong)uVar13;
          piVar4[local_68] = uVar13;
          if ((uVar28 & 2) != 0) {
            __assert_fail("pRef->fVisit == 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/abs/absGlaOld.c"
                          ,0x24b,"Vec_Int_t *Gla_ManRefinement2(Gla_Man_t *)");
          }
          lVar20 = lVar20 + 1;
        } while (iVar14 != lVar20);
      }
      uVar13 = vPPis->nSize;
      if (vPPis->nSize < 1) {
        uVar13 = 0;
      }
      uVar28 = 8;
      uVar29 = 0;
      while (uVar13 != uVar29) {
        iVar14 = vPPis->pArray[uVar29];
        lVar20 = (long)iVar14;
        if (lVar20 < 0) goto LAB_00581f7f;
        pGVar7 = p->pGia;
        if (pGVar7->nObjs <= iVar14) goto LAB_00581f7f;
        pVVar25 = (Vec_Int_t *)pGVar7->pObjs;
        if (pVVar25 == (Vec_Int_t *)0x0) break;
        piVar17 = &pVVar25->nCap + lVar20 * 3;
        uVar24 = *(ulong *)piVar17;
        uVar22 = (uint)uVar24;
        if (((int)uVar22 < 0 || (~uVar22 & 0x1fffffff) == 0) &&
           (((uVar22 & 0x9fffffff) != 0x9fffffff ||
            (uVar22 = (uint)(uVar24 >> 0x20) & 0x1fffffff, uVar24 = (ulong)uVar22,
            (int)uVar22 < pGVar7->vCis->nSize - pGVar7->nRegs)))) {
          __assert_fail("Gia_ObjIsAnd(pObj) || Gia_ObjIsRo(p->pGia, pObj)",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/abs/absGlaOld.c"
                        ,0x251,"Vec_Int_t *Gla_ManRefinement2(Gla_Man_t *)");
        }
        if (pGVar7->nObjs <= iVar14) goto LAB_00581f60;
        pVVar18 = p->pvRefis;
        pVVar25 = pVVar18 + lVar20;
        Vec_IntFillExtra(pVVar25,iVar16,(int)uVar24);
        if (pVVar18[lVar20].nSize <= local_68) goto LAB_00581f96;
        piVar4 = pVVar25->pArray;
        piVar4[local_68] = 0;
        pGVar2 = p->pGia->pObjs;
        if ((piVar17 < pGVar2) || (pGVar2 + p->pGia->nObjs <= piVar17)) goto LAB_00581f60;
        iVar14 = (int)((ulong)((long)piVar17 - (long)pGVar2) >> 2) * -0x55555555;
        iVar11 = Gla_ManCheckVar(p,p->pObj2Obj[iVar14],iVar15);
        if (iVar11 == 0) {
          uVar22 = 0;
        }
        else {
          psVar6 = p->pSat;
          uVar22 = Gla_ManGetVar(p,p->pObj2Obj[iVar14],iVar15);
          if (((int)uVar22 < 0) || (psVar6->size <= (int)uVar22)) goto LAB_00581fb5;
          uVar22 = (uint)(psVar6->model[uVar22] == 1);
        }
        uVar1 = piVar4[local_68];
        uVar29 = uVar29 + 1;
        uVar22 = (uVar1 & 0xfff80002) + (uVar28 & 0x7fff8 | uVar22) + 4;
        piVar4[local_68] = uVar22;
        uVar23 = (Gla_ManRefinement2::Sign & 0xfffU) << 0x13;
        pVVar25 = (Vec_Int_t *)(ulong)uVar23;
        piVar4[local_68] = uVar22 & 0x8007ffff | uVar23;
        uVar28 = uVar28 + 8;
        if ((uVar1 & 2) != 0) {
          __assert_fail("pRef->fVisit == 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/abs/absGlaOld.c"
                        ,599,"Vec_Int_t *Gla_ManRefinement2(Gla_Man_t *)");
        }
      }
      if (0 < vRoAnds->nSize) {
        lVar20 = 0;
        do {
          iVar14 = vRoAnds->pArray[lVar20];
          lVar26 = (long)iVar14;
          if (lVar26 < 0) goto LAB_00581f7f;
          pGVar7 = p->pGia;
          if (pGVar7->nObjs <= iVar14) goto LAB_00581f7f;
          pVVar25 = (Vec_Int_t *)pGVar7->pObjs;
          if (pVVar25 == (Vec_Int_t *)0x0) break;
          piVar17 = &pVVar25->nCap + lVar26 * 3;
          uVar29 = *(ulong *)piVar17;
          uVar13 = (uint)uVar29;
          if (((int)uVar13 < 0 || (~uVar13 & 0x1fffffff) == 0) &&
             (((uVar13 & 0x9fffffff) != 0x9fffffff ||
              (uVar13 = (uint)(uVar29 >> 0x20) & 0x1fffffff, uVar29 = (ulong)uVar13,
              (int)uVar13 < pGVar7->vCis->nSize - pGVar7->nRegs)))) {
            __assert_fail("Gia_ObjIsAnd(pObj) || Gia_ObjIsRo(p->pGia, pObj)",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/abs/absGlaOld.c"
                          ,0x25c,"Vec_Int_t *Gla_ManRefinement2(Gla_Man_t *)");
          }
          if (pGVar7->nObjs <= iVar14) goto LAB_00581f60;
          pVVar18 = p->pvRefis;
          pVVar25 = pVVar18 + lVar26;
          Vec_IntFillExtra(pVVar25,iVar16,(int)uVar29);
          if (pVVar18[lVar26].nSize <= local_68) goto LAB_00581f96;
          piVar4 = pVVar25->pArray;
          piVar4[local_68] = 0;
          pGVar7 = p->pGia;
          uVar13 = (uint)*(undefined8 *)piVar17;
          if (((uVar13 & 0x9fffffff) == 0x9fffffff) &&
             (uVar28 = (uint)((ulong)*(undefined8 *)piVar17 >> 0x20),
             pGVar7->vCis->nSize - pGVar7->nRegs <= (int)(uVar28 & 0x1fffffff))) {
            if (local_68 == 0) {
              *piVar4 = 0;
              uVar13 = (Gla_ManRefinement2::Sign & 0xfffU) << 0x13;
            }
            else {
              uVar28 = uVar28 & 0x1fffffff;
              iVar14 = pGVar7->vCis->nSize;
              if ((int)uVar28 < iVar14 - pGVar7->nRegs) {
                __assert_fail("Gia_ObjIsRo(p, pObj)",
                              "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                              ,0x1db,"Gia_Obj_t *Gia_ObjRoToRi(Gia_Man_t *, Gia_Obj_t *)");
              }
              iVar11 = pGVar7->vCos->nSize;
              uVar28 = (iVar11 - iVar14) + uVar28;
              if (((int)uVar28 < 0) || (iVar11 <= (int)uVar28)) goto LAB_005820cc;
              iVar14 = pGVar7->vCos->pArray[uVar28];
              lVar26 = (long)iVar14;
              if ((lVar26 < 0) || (pGVar7->nObjs <= iVar14)) goto LAB_00581f7f;
              pVVar18 = p->pvRefis;
              pVVar25 = pVVar18 + lVar26;
              Vec_IntFillExtra(pVVar25,iVar15,uVar28);
              if (pVVar18[lVar26].nSize < local_68) goto LAB_00581f96;
              piVar17 = pVVar25->pArray;
              uVar22 = piVar17[local_68 + -1] & 1;
              uVar13 = piVar4[local_68];
              piVar4[local_68] = uVar13 & 0xfffffffe | uVar22;
              uVar28 = piVar17[local_68 + -1] & 0x7fff8;
              piVar4[local_68] = uVar13 & 0xfff80006 | uVar22 | uVar28;
              uVar13 = uVar13 & 0x80000006 | uVar22 | uVar28 |
                       (Gla_ManRefinement2::Sign & 0xfffU) << 0x13;
            }
          }
          else {
            if (((int)uVar13 < 0) || ((uVar13 & 0x1fffffff) == 0x1fffffff)) {
              __assert_fail("Gia_ObjIsAnd(pObj)",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/abs/absGlaOld.c"
                            ,0x26f,"Vec_Int_t *Gla_ManRefinement2(Gla_Man_t *)");
            }
            piVar21 = piVar17 + (ulong)(uVar13 & 0x1fffffff) * -3;
            pGVar2 = pGVar7->pObjs;
            if ((piVar21 < pGVar2) || (pGVar2 + pGVar7->nObjs <= piVar21)) goto LAB_00581f60;
            pVVar18 = p->pvRefis;
            iVar14 = (int)((ulong)((long)piVar21 - (long)pGVar2) >> 2) * -0x55555555;
            pVVar25 = pVVar18 + iVar14;
            Vec_IntFillExtra(pVVar25,iVar16,(int)pGVar2);
            if (pVVar18[iVar14].nSize <= local_68) goto LAB_00581f96;
            piVar21 = piVar17 + (ulong)(piVar17[1] & 0x1fffffff) * -3;
            pGVar2 = p->pGia->pObjs;
            if ((piVar21 < pGVar2) || (pGVar2 + p->pGia->nObjs <= piVar21)) goto LAB_00581f60;
            piVar8 = pVVar25->pArray;
            pVVar18 = p->pvRefis;
            iVar14 = (int)((ulong)((long)piVar21 - (long)pGVar2) >> 2) * -0x55555555;
            pVVar25 = pVVar18 + iVar14;
            Vec_IntFillExtra(pVVar25,iVar16,(int)(pGVar2 + p->pGia->nObjs));
            if (pVVar18[iVar14].nSize <= local_68) goto LAB_00581f96;
            piVar21 = pVVar25->pArray;
            piVar4[local_68] =
                 piVar4[local_68] & 0xfffffffeU |
                 ((uint)(*(ulong *)piVar17 >> 0x3d) ^ piVar21[local_68]) &
                 ((uint)(*(ulong *)piVar17 >> 0x1d) & 7 ^ piVar8[local_68]) & 1;
            pGVar2 = p->pGia->pObjs;
            if ((piVar17 < pGVar2) || (pGVar2 + p->pGia->nObjs <= piVar17)) goto LAB_00581f60;
            if ((p->pObj2Obj[(int)((ulong)((long)piVar17 - (long)pGVar2) >> 2) * -0x55555555] !=
                 0xffffffff) &&
               (iVar14 = Gla_ManCheckVar(p,p->pObj2Obj
                                           [(int)((ulong)((long)piVar17 - (long)pGVar2) >> 2) *
                                            -0x55555555],iVar15), iVar14 != 0)) {
              pGVar2 = p->pGia->pObjs;
              if ((piVar17 < pGVar2) || (pGVar2 + p->pGia->nObjs <= piVar17)) goto LAB_00581f60;
              uVar13 = piVar4[local_68];
              iVar14 = (int)((ulong)((long)piVar17 - (long)pGVar2) >> 2) * -0x55555555;
              pGVar27 = p;
              iVar11 = Gla_ManCheckVar(p,p->pObj2Obj[iVar14],iVar15);
              iVar12 = (int)pGVar27;
              if (iVar11 == 0) {
                uVar28 = 0;
              }
              else {
                psVar6 = p->pSat;
                pGVar27 = p;
                uVar28 = Gla_ManGetVar(p,p->pObj2Obj[iVar14],iVar15);
                iVar12 = (int)pGVar27;
                if (((int)uVar28 < 0) || (psVar6->size <= (int)uVar28)) {
LAB_00581fb5:
                  __assert_fail("v >= 0 && v < s->size",
                                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satSolver2.h"
                                ,0xd4,"int sat_solver2_var_value(sat_solver2 *, int)");
                }
                uVar28 = (uint)(psVar6->model[uVar28] == 1);
              }
              if ((uVar13 & 1) != uVar28) {
                Abc_Print(iVar12,"Object has value mismatch    ");
                Gia_ObjPrint(p->pGia,(Gia_Obj_t *)piVar17);
              }
            }
            uVar13 = piVar4[local_68];
            uVar28 = piVar8[local_68];
            if ((uVar13 & 1) == 0) {
              uVar22 = (uint)(*(ulong *)piVar17 >> 0x1d) & 7 ^ uVar28;
              if ((uVar22 & 1) == 0) {
                if ((((uint)(*(ulong *)piVar17 >> 0x3d) ^ piVar21[local_68]) & 1) != 0) {
                  if ((uVar22 & 1) == 0) {
                    uVar28 = uVar28 & 0x7fff8;
                    uVar22 = 0xfff80006;
                    goto LAB_005819e7;
                  }
                  goto LAB_005819d7;
                }
                uVar22 = uVar28 >> 3 & 0xffff;
                uVar28 = (uint)piVar21[local_68] >> 3 & 0xffff;
                if (uVar22 < uVar28) {
                  uVar28 = uVar22;
                }
                uVar28 = uVar28 << 3;
              }
              else {
LAB_005819d7:
                uVar28 = piVar21[local_68] & 0x7fff8;
              }
              uVar22 = 0xfff80006;
            }
            else {
              uVar22 = uVar28 >> 3 & 0xffff;
              uVar28 = (uint)piVar21[local_68] >> 3 & 0xffff;
              if (uVar28 < uVar22) {
                uVar28 = uVar22;
              }
              uVar28 = uVar28 << 3;
              uVar22 = 0xfff80007;
            }
LAB_005819e7:
            piVar4[local_68] = uVar22 & uVar13 | uVar28;
            if ((uVar13 & 2) != 0) {
              __assert_fail("pRef->fVisit == 0",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/abs/absGlaOld.c"
                            ,0x284,"Vec_Int_t *Gla_ManRefinement2(Gla_Man_t *)");
            }
            uVar13 = uVar22 & uVar13 & 0x8007fffd | uVar28 |
                     (Gla_ManRefinement2::Sign & 0xfffU) << 0x13;
          }
          piVar4[local_68] = uVar13;
          lVar20 = lVar20 + 1;
          pVVar25 = vRoAnds;
        } while (lVar20 < vRoAnds->nSize);
      }
      iVar14 = vCos->nSize;
      if (0 < (long)iVar14) {
        piVar17 = vCos->pArray;
        lVar20 = 0;
        do {
          lVar26 = (long)piVar17[lVar20];
          if ((lVar26 < 0) || (p->pGia->nObjs <= piVar17[lVar20])) goto LAB_00581f7f;
          pGVar2 = p->pGia->pObjs;
          if (pGVar2 == (Gia_Obj_t *)0x0) break;
          pVVar3 = p->pvRefis;
          pVVar18 = pVVar3 + lVar26;
          Vec_IntFillExtra(pVVar18,iVar16,(int)pVVar25);
          if (pVVar3[lVar26].nSize <= local_68) goto LAB_00581f96;
          pGVar2 = pGVar2 + lVar26;
          piVar4 = pVVar18->pArray;
          piVar4[local_68] = 0;
          pGVar5 = pGVar2 + -(ulong)((uint)*(undefined8 *)pGVar2 & 0x1fffffff);
          pGVar9 = p->pGia->pObjs;
          if ((pGVar5 < pGVar9) || (pGVar9 + p->pGia->nObjs <= pGVar5)) goto LAB_00581f60;
          pVVar18 = p->pvRefis;
          iVar15 = (int)((ulong)((long)pGVar5 - (long)pGVar9) >> 2) * -0x55555555;
          pVVar25 = pVVar18 + iVar15;
          Vec_IntFillExtra(pVVar25,iVar16,(int)(pGVar9 + p->pGia->nObjs));
          if (pVVar18[iVar15].nSize <= local_68) goto LAB_00581f96;
          piVar21 = pVVar25->pArray;
          uVar13 = piVar4[local_68];
          uVar22 = (*(uint *)pGVar2 >> 0x1d ^ piVar21[local_68]) & 1;
          piVar4[local_68] = uVar13 & 0xfffffffe | uVar22;
          pVVar25 = (Vec_Int_t *)0x7fff8;
          uVar28 = piVar21[local_68] & 0x7fff8;
          piVar4[local_68] = uVar13 & 0xfff80006 | uVar22 | uVar28;
          if ((uVar13 & 2) != 0) {
            __assert_fail("pRef->fVisit == 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/abs/absGlaOld.c"
                          ,0x28e,"Vec_Int_t *Gla_ManRefinement2(Gla_Man_t *)");
          }
          piVar4[local_68] =
               uVar13 & 0x80000004 | uVar22 | uVar28 | (Gla_ManRefinement2::Sign & 0xfffU) << 0x13;
          lVar20 = lVar20 + 1;
        } while (iVar14 != lVar20);
      }
      uVar13 = p->pPars->iFrame;
      bVar10 = local_68 < (int)uVar13;
      local_68 = local_68 + 1;
    } while (bVar10);
  }
  pGVar7 = p->pGia;
  iVar16 = pGVar7->vCos->nSize;
  if (iVar16 <= pGVar7->nRegs) {
LAB_005820eb:
    __assert_fail("v < Gia_ManPoNum(p)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                  ,0x1b3,"Gia_Obj_t *Gia_ManPo(Gia_Man_t *, int)");
  }
  if (iVar16 < 1) {
LAB_005820cc:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                  ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
  }
  iVar14 = *pGVar7->vCos->pArray;
  if ((-1 < (long)iVar14) && (iVar14 < pGVar7->nObjs)) {
    pVVar18 = p->pvRefis + iVar14;
    pVVar25 = pVVar18;
    Vec_IntFillExtra(pVVar18,uVar13 + 1,iVar16);
    if (((int)uVar13 < 0) || (pVVar18->nSize <= (int)uVar13)) {
LAB_00581f96:
      __assertion = "i >= 0 && i < p->nSize";
      __file = 
      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
      ;
      __function = "int *Vec_IntEntryP(Vec_Int_t *, int)";
      goto LAB_00581fab;
    }
    piVar17 = pVVar18->pArray;
    if ((*(byte *)(piVar17 + uVar13) & 1) == 0) {
      Abc_Print((int)pVVar25,"\nCounter-example verification has failed!!!\n");
    }
    if ((piVar17[uVar13] & 0x7fff8U) == 0) {
      pAVar19 = Gla_ManDeriveCex(p,vPis);
      p->pGia->pCexSeq = pAVar19;
      if (vPis->pArray != (int *)0x0) {
        free(vPis->pArray);
        vPis->pArray = (int *)0x0;
      }
      free(vPis);
      if (vPPis->pArray != (int *)0x0) {
        free(vPPis->pArray);
        vPPis->pArray = (int *)0x0;
      }
      free(vPPis);
      if (vRoAnds->pArray != (int *)0x0) {
        free(vRoAnds->pArray);
        vRoAnds->pArray = (int *)0x0;
      }
      free(vRoAnds);
      if (vCos->pArray != (int *)0x0) {
        free(vCos->pArray);
        vCos->pArray = (int *)0x0;
      }
      free(vCos);
      return (Vec_Int_t *)0x0;
    }
    pVVar18 = (Vec_Int_t *)malloc(0x10);
    pVVar18->nCap = 100;
    pVVar18->nSize = 0;
    piVar17 = (int *)malloc(400);
    pVVar18->pArray = piVar17;
    pVVar25 = p->vObjCounts;
    iVar16 = p->pPars->iFrame;
    uVar29 = (long)iVar16 + 1;
    if (pVVar25->nCap <= iVar16) {
      if (pVVar25->pArray == (int *)0x0) {
        piVar17 = (int *)malloc(uVar29 * 4);
      }
      else {
        piVar17 = (int *)realloc(pVVar25->pArray,uVar29 * 4);
      }
      pVVar25->pArray = piVar17;
      if (piVar17 == (int *)0x0) {
        __assert_fail("p->pArray",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                      ,0x20c,"void Vec_IntGrow(Vec_Int_t *, int)");
      }
      pVVar25->nCap = (int)uVar29;
    }
    if (-1 < iVar16) {
      memset(pVVar25->pArray,0,(uVar29 & 0xffffffff) << 2);
    }
    pVVar25->nSize = (int)uVar29;
    pGVar7 = p->pGia;
    iVar16 = pGVar7->vCos->nSize;
    if (iVar16 <= pGVar7->nRegs) goto LAB_005820eb;
    if (iVar16 < 1) goto LAB_005820cc;
    iVar16 = *pGVar7->vCos->pArray;
    if ((-1 < (long)iVar16) && (iVar16 < pGVar7->nObjs)) {
      Gla_ManRefSelect_rec
                (p,pGVar7->pObjs + iVar16 +
                   -(ulong)((uint)*(undefined8 *)(pGVar7->pObjs + iVar16) & 0x1fffffff),
                 p->pPars->iFrame,pVVar18,Gla_ManRefinement2::Sign);
      if (1 < (long)pVVar18->nSize) {
        qsort(pVVar18->pArray,(long)pVVar18->nSize,4,Vec_IntSortCompare1);
        iVar16 = 1;
        if (1 < pVVar18->nSize) {
          piVar17 = pVVar18->pArray;
          lVar20 = 1;
          do {
            if (piVar17[lVar20] != piVar17[lVar20 + -1]) {
              lVar26 = (long)iVar16;
              iVar16 = iVar16 + 1;
              piVar17[lVar26] = piVar17[lVar20];
            }
            lVar20 = lVar20 + 1;
          } while (lVar20 < pVVar18->nSize);
        }
        pVVar18->nSize = iVar16;
      }
      Gla_ManVerifyUsingTerSim(p,vPis,vPPis,vRoAnds,vCos,pVVar18);
      if (0 < pVVar18->nSize) {
        pGVar7 = p->pGia;
        piVar17 = pVVar18->pArray;
        lVar20 = 0;
        do {
          iVar16 = piVar17[lVar20];
          if (((long)iVar16 < 0) || (pGVar7->nObjs <= iVar16)) goto LAB_00581f7f;
          if (pGVar7->pObjs == (Gia_Obj_t *)0x0) break;
          piVar17[lVar20] = p->pObj2Obj[iVar16];
          lVar20 = lVar20 + 1;
        } while (lVar20 < pVVar18->nSize);
      }
      if (vPis->pArray != (int *)0x0) {
        free(vPis->pArray);
        vPis->pArray = (int *)0x0;
      }
      free(vPis);
      if (vPPis->pArray != (int *)0x0) {
        free(vPPis->pArray);
        vPPis->pArray = (int *)0x0;
      }
      free(vPPis);
      if (vRoAnds->pArray != (int *)0x0) {
        free(vRoAnds->pArray);
        vRoAnds->pArray = (int *)0x0;
      }
      free(vRoAnds);
      if (vCos->pArray != (int *)0x0) {
        free(vCos->pArray);
        vCos->pArray = (int *)0x0;
      }
      free(vCos);
      p->nObjAdded = p->nObjAdded + pVVar18->nSize;
      return pVVar18;
    }
  }
LAB_00581f7f:
  __assertion = "v >= 0 && v < p->nObjs";
  __file = 
  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h";
  __function = "Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)";
LAB_00581fab:
  __assert_fail(__assertion,__file,0x1af,__function);
}

Assistant:

Vec_Int_t * Gla_ManRefinement2( Gla_Man_t * p )
{
    int fVerify = 1;
    static int Sign = 0;
    Vec_Int_t * vPis, * vPPis, * vCos, * vRoAnds, * vSelect = NULL;
    Rfn_Obj_t * pRef, * pRef0, * pRef1;
    Gia_Obj_t * pObj;
    int i, f;
    Sign++;

    // compute PIs and pseudo-PIs
    vCos = Vec_IntAlloc( 1000 );
    vPis = Vec_IntAlloc( 1000 );  
    vPPis = Vec_IntAlloc( 1000 );
    vRoAnds = Vec_IntAlloc( 1000 );  
    Gla_ManCollect( p, vPis, vPPis, vCos, vRoAnds );

/*
    // check how many pseudo PIs have variables
    Gla_ManForEachObjAbsVec( vPis, p, pGla, i )
    {
        Abc_Print( 1, "  %5d : ", Gla_ObjId(p, pGla) );
        for ( f = 0; f <= p->pPars->iFrame; f++ )
            Abc_Print( 1, "%d", Gla_ManCheckVar(p, Gla_ObjId(p, pGla), f) );
        Abc_Print( 1, "\n" );
    }    

    // check how many pseudo PIs have variables
    Gla_ManForEachObjAbsVec( vPPis, p, pGla, i )
    {
        Abc_Print( 1, "%5d : ", Gla_ObjId(p, pGla) );
        for ( f = 0; f <= p->pPars->iFrame; f++ )
            Abc_Print( 1, "%d", Gla_ManCheckVar(p, Gla_ObjId(p, pGla), f) );
        Abc_Print( 1, "\n" );
    }    
*/
    // propagate values
    for ( f = 0; f <= p->pPars->iFrame; f++ )
    {
        // constant
        pRef = Gla_ObjRef( p, Gia_ManConst0(p->pGia), f );  Gla_ObjClearRef( pRef );
        pRef->Value  = 0;
        pRef->Prio   = 0;
        pRef->Sign   = Sign;
        // primary input
        Gia_ManForEachObjVec( vPis, p->pGia, pObj, i )
        {
//            assert( f == p->pPars->iFrame || Gla_ManCheckVar(p, p->pObj2Obj[Gia_ObjId(p->pGia, pObj)], f) );
            pRef = Gla_ObjRef( p, pObj, f );   Gla_ObjClearRef( pRef );
            pRef->Value = Gla_ObjSatValue( p, Gia_ObjId(p->pGia, pObj), f );
            pRef->Prio  = 0;
            pRef->Sign  = Sign;
            assert( pRef->fVisit == 0 );
        }
        // primary input
        Gia_ManForEachObjVec( vPPis, p->pGia, pObj, i )
        {
//            assert( f == p->pPars->iFrame || Gla_ManCheckVar(p, p->pObj2Obj[Gia_ObjId(p->pGia, pObj)], f) );
            assert( Gia_ObjIsAnd(pObj) || Gia_ObjIsRo(p->pGia, pObj) );
            pRef = Gla_ObjRef( p, pObj, f );   Gla_ObjClearRef( pRef );
            pRef->Value = Gla_ObjSatValue( p, Gia_ObjId(p->pGia, pObj), f );
            pRef->Prio  = i+1;
            pRef->fPPi  = 1;
            pRef->Sign  = Sign;
            assert( pRef->fVisit == 0 );
        }
        // internal nodes
        Gia_ManForEachObjVec( vRoAnds, p->pGia, pObj, i )
        {
            assert( Gia_ObjIsAnd(pObj) || Gia_ObjIsRo(p->pGia, pObj) );
            pRef = Gla_ObjRef( p, pObj, f );   Gla_ObjClearRef( pRef );
            if ( Gia_ObjIsRo(p->pGia, pObj) )
            {
                if ( f == 0 )
                {
                    pRef->Value = 0;
                    pRef->Prio  = 0;
                    pRef->Sign  = Sign;
                }
                else
                {
                    pRef0 = Gla_ObjRef( p, Gia_ObjRoToRi(p->pGia, pObj), f-1 );
                    pRef->Value = pRef0->Value;
                    pRef->Prio  = pRef0->Prio;
                    pRef->Sign  = Sign;
                }
                continue;
            }
            assert( Gia_ObjIsAnd(pObj) );
            pRef0 = Gla_ObjRef( p, Gia_ObjFanin0(pObj), f );
            pRef1 = Gla_ObjRef( p, Gia_ObjFanin1(pObj), f );
            pRef->Value = (pRef0->Value ^ Gia_ObjFaninC0(pObj)) & (pRef1->Value ^ Gia_ObjFaninC1(pObj));

            if ( p->pObj2Obj[Gia_ObjId(p->pGia, pObj)] != ~0 && 
                 Gla_ManCheckVar(p, p->pObj2Obj[Gia_ObjId(p->pGia, pObj)], f) &&
                 (int)pRef->Value != Gla_ObjSatValue(p, Gia_ObjId(p->pGia, pObj), f) )
            {
                    Abc_Print( 1, "Object has value mismatch    " );
                    Gia_ObjPrint( p->pGia, pObj );
            }

            if ( pRef->Value == 1 )
                pRef->Prio  = Abc_MaxInt( pRef0->Prio, pRef1->Prio );
            else if ( (pRef0->Value ^ Gia_ObjFaninC0(pObj)) == 0 && (pRef1->Value ^ Gia_ObjFaninC1(pObj)) == 0 )
                pRef->Prio  = Abc_MinInt( pRef0->Prio, pRef1->Prio ); // choice
            else if ( (pRef0->Value ^ Gia_ObjFaninC0(pObj)) == 0 )
                pRef->Prio  = pRef0->Prio;
            else 
                pRef->Prio  = pRef1->Prio;
            assert( pRef->fVisit == 0 );
            pRef->Sign  = Sign;
        }
        // output nodes
        Gia_ManForEachObjVec( vCos, p->pGia, pObj, i )
        {
            pRef = Gla_ObjRef( p, pObj, f );    Gla_ObjClearRef( pRef );
            pRef0 = Gla_ObjRef( p, Gia_ObjFanin0(pObj), f ); 
            pRef->Value = (pRef0->Value ^ Gia_ObjFaninC0(pObj));
            pRef->Prio  = pRef0->Prio;
            assert( pRef->fVisit == 0 );
            pRef->Sign  = Sign;
        }
    } 

    // make sure the output value is 1
    pObj = Gia_ManPo( p->pGia, 0 );
    pRef = Gla_ObjRef( p, pObj, p->pPars->iFrame );
    if ( pRef->Value != 1 )
        Abc_Print( 1, "\nCounter-example verification has failed!!!\n" );

    // check the CEX
    if ( pRef->Prio == 0 )
    {
        p->pGia->pCexSeq = Gla_ManDeriveCex( p, vPis );
        Vec_IntFree( vPis );
        Vec_IntFree( vPPis );
        Vec_IntFree( vRoAnds );
        Vec_IntFree( vCos );
        return NULL;
    }

    // select objects
    vSelect = Vec_IntAlloc( 100 );
    Vec_IntFill( p->vObjCounts, p->pPars->iFrame+1, 0 );
    Gla_ManRefSelect_rec( p, Gia_ObjFanin0(Gia_ManPo(p->pGia, 0)), p->pPars->iFrame, vSelect, Sign );
    Vec_IntUniqify( vSelect );

/*
    for ( f = 0; f < p->pPars->iFrame; f++ )
        printf( "%2d", Vec_IntEntry(p->vObjCounts, f) );
    printf( "\n" );
*/
    if ( fVerify )
        Gla_ManVerifyUsingTerSim( p, vPis, vPPis, vRoAnds, vCos, vSelect );

    // remap them into GLA objects
    Gia_ManForEachObjVec( vSelect, p->pGia, pObj, i )
        Vec_IntWriteEntry( vSelect, i, p->pObj2Obj[Gia_ObjId(p->pGia, pObj)] );

    Vec_IntFree( vPis );
    Vec_IntFree( vPPis );
    Vec_IntFree( vRoAnds );
    Vec_IntFree( vCos );

    p->nObjAdded += Vec_IntSize(vSelect);
    return vSelect;
}